

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_impl_ssse3.c
# Opt level: O1

void aom_var_filter_block2d_bil_second_pass_ssse3
               (uint16_t *a,uint8_t *b,uint src_pixels_per_line,uint pixel_step,uint output_height,
               uint output_width,uint8_t *filter)

{
  undefined8 uVar1;
  ulong uVar2;
  uint3 uVar3;
  uint3 uVar4;
  uint uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  if (output_height != 0) {
    uVar4 = CONCAT12((char)((ushort)*(undefined2 *)filter >> 8),*(undefined2 *)filter);
    uVar3 = uVar4 & 0xff00ff;
    auVar7[7] = 0;
    auVar7._0_7_ = CONCAT34(uVar4,(uint)uVar3) & 0xff00ffffffffff;
    auVar7._8_3_ = uVar3;
    auVar7[0xb] = 0;
    auVar7._12_3_ = uVar3;
    auVar7[0xf] = 0;
    uVar5 = 0;
    do {
      if (output_width != 0) {
        lVar6 = 0;
        do {
          uVar1 = *(undefined8 *)((long)a + (ulong)pixel_step * 2);
          uVar2 = *(ulong *)a;
          auVar10._8_4_ = 0;
          auVar10._0_8_ = uVar2;
          auVar10._12_2_ = (short)(uVar2 >> 0x30);
          auVar10._14_2_ = (short)((ulong)uVar1 >> 0x30);
          auVar9._12_4_ = auVar10._12_4_;
          auVar9._8_2_ = 0;
          auVar9._0_8_ = uVar2;
          auVar9._10_2_ = (short)((ulong)uVar1 >> 0x20);
          auVar8._10_6_ = auVar9._10_6_;
          auVar8._8_2_ = (short)(uVar2 >> 0x20);
          auVar8._0_8_ = uVar2;
          auVar11._8_8_ = auVar8._8_8_;
          auVar11._6_2_ = (short)((ulong)uVar1 >> 0x10);
          auVar11._4_2_ = (short)(uVar2 >> 0x10);
          auVar11._0_2_ = (undefined2)uVar2;
          auVar11._2_2_ = (short)uVar1;
          auVar11 = pmaddwd(auVar11,auVar7);
          auVar12._0_4_ = auVar11._0_4_ + 0x40U >> 7;
          auVar12._4_4_ = auVar11._4_4_ + 0x40U >> 7;
          auVar12._8_4_ = auVar11._8_4_ + 0x40U >> 7;
          auVar12._12_4_ = auVar11._12_4_ + 0x40U >> 7;
          auVar11 = pshufb(auVar12,ZEXT416(0xc080400));
          *(int *)(b + lVar6) = auVar11._0_4_;
          a = (uint16_t *)((long)a + 8);
          lVar6 = lVar6 + 4;
        } while ((uint)lVar6 < output_width);
        b = b + lVar6;
      }
      a = (uint16_t *)((long)a + (ulong)(src_pixels_per_line - output_width) * 2);
      uVar5 = uVar5 + 1;
    } while (uVar5 != output_height);
  }
  return;
}

Assistant:

void aom_var_filter_block2d_bil_second_pass_ssse3(
    const uint16_t *a, uint8_t *b, unsigned int src_pixels_per_line,
    unsigned int pixel_step, unsigned int output_height,
    unsigned int output_width, const uint8_t *filter) {
  const int16_t round = (1 << FILTER_BITS) >> 1;
  const __m128i r = _mm_set1_epi32(round);
  const __m128i filters =
      _mm_setr_epi16(filter[0], filter[1], filter[0], filter[1], filter[0],
                     filter[1], filter[0], filter[1]);
  const __m128i shuffle_mask =
      _mm_setr_epi8(0, 1, 8, 9, 2, 3, 10, 11, 4, 5, 12, 13, 6, 7, 14, 15);
  const __m128i mask =
      _mm_setr_epi8(0, 4, 8, 12, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1);
  unsigned int i, j;

  for (i = 0; i < output_height; ++i) {
    for (j = 0; j < output_width; j += 4) {
      // load source as:
      // { a[0], a[1], a[2], a[3], a[w], a[w+1], a[w+2], a[w+3] }
      __m128i source1 = xx_loadl_64(a);
      __m128i source2 = xx_loadl_64(a + pixel_step);
      __m128i source = _mm_unpacklo_epi64(source1, source2);

      // shuffle source to:
      // { a[0], a[w], a[1], a[w+1], a[2], a[w+2], a[3], a[w+3] }
      __m128i source_shuffle = _mm_shuffle_epi8(source, shuffle_mask);

      // b[i] = a[i] * filter[0] + a[w + i] * filter[1]
      __m128i res = _mm_madd_epi16(source_shuffle, filters);

      // round
      res = _mm_srai_epi32(_mm_add_epi32(res, r), FILTER_BITS);

      // shuffle to get each lower 8 bit of every 32 bit
      res = _mm_shuffle_epi8(res, mask);

      xx_storel_32(b, res);

      a += 4;
      b += 4;
    }

    a += src_pixels_per_line - output_width;
  }
}